

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void writeout_json_report
               (AppCtx *ctx,Instance *instance,Solution *solution,SolveStatus status,Timing timing)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  cJSON_bool cVar9;
  cJSON_bool cVar10;
  cJSON_bool cVar11;
  cJSON_bool cVar12;
  cJSON_bool cVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  FILE *__stream;
  cJSON *pcVar29;
  cJSON *pcVar30;
  char *pcVar31;
  size_t sVar32;
  int32_t *piVar33;
  cJSON *item;
  bool bVar34;
  double dVar35;
  double num;
  double num_00;
  char *local_1118;
  char *local_1108;
  char *content;
  cJSON *constants_obj;
  int32_t next_vertex;
  int32_t curr_vertex;
  cJSON *route_array;
  double demand;
  double profit;
  double cost;
  cJSON *tour_info_obj;
  cJSON *bounds_obj;
  char *time;
  TimeRepr timerepr;
  char timerepr_str [4096];
  cJSON *timing_obj;
  cJSON *status_obj;
  cJSON *instance_info_obj;
  _Bool s;
  _Bool closed_problem;
  _Bool res_exhaustion_abortion;
  _Bool sigterm_abortion;
  _Bool valid;
  _Bool primal_sol_avail;
  FILE *fh;
  cJSON *root;
  SolveStatus status_local;
  Solution *solution_local;
  Instance *instance_local;
  AppCtx *ctx_local;
  
  if (ctx->json_report_path != (char *)0x0) {
    fh = (FILE *)0x0;
    __stream = fopen(ctx->json_report_path,"w");
    if (__stream == (FILE *)0x0) {
      log_log(0x80,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/main.c"
              ,0x99,"%s: failed to open file for writing JSON report",ctx->json_report_path);
    }
    else {
      fh = (FILE *)cJSON_CreateObject();
      if (fh == (FILE *)0x0) {
        log_log(0x80,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/main.c"
                ,0x9f,"%s :: Failed to create JSON root object","writeout_json_report");
      }
      else {
        bVar34 = (status & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL) != SOLVE_STATUS_NULL;
        pcVar29 = cJSON_CreateString(ctx->solver);
        uVar2 = cJSON_AddItemToObject((cJSON *)fh,"solverName",pcVar29);
        pcVar29 = cJSON_CreateNumber(ctx->timelimit);
        uVar3 = cJSON_AddItemToObject((cJSON *)fh,"timeLimit",pcVar29);
        pcVar29 = cJSON_CreateNumber((double)ctx->randomseed);
        uVar4 = cJSON_AddItemToObject((cJSON *)fh,"randomSeed",pcVar29);
        pcVar29 = cJSON_CreateStringArray(ctx->defines,ctx->num_defines);
        uVar5 = cJSON_AddItemToObject((cJSON *)fh,"cmdLineDefines",pcVar29);
        pcVar29 = cJSON_CreateString(ctx->instance_filepath);
        uVar6 = cJSON_AddItemToObject((cJSON *)fh,"inputFile",pcVar29);
        pcVar29 = cJSON_CreateObject();
        uVar7 = cJSON_AddItemToObject((cJSON *)fh,"instanceInfo",pcVar29);
        if (instance->name == (char *)0x0) {
          local_1108 = "";
        }
        else {
          local_1108 = instance->name;
        }
        pcVar30 = cJSON_CreateString(local_1108);
        uVar8 = cJSON_AddItemToObject(pcVar29,"name",pcVar30);
        if (instance->comment == (char *)0x0) {
          local_1118 = "";
        }
        else {
          local_1118 = instance->comment;
        }
        pcVar30 = cJSON_CreateString(local_1118);
        cVar9 = cJSON_AddItemToObject(pcVar29,"comment",pcVar30);
        pcVar30 = cJSON_CreateNumber(instance->vehicle_cap);
        cVar10 = cJSON_AddItemToObject(pcVar29,"vehicleCap",pcVar30);
        pcVar30 = cJSON_CreateNumber((double)instance->num_customers);
        cVar11 = cJSON_AddItemToObject(pcVar29,"numCustomers",pcVar30);
        pcVar30 = cJSON_CreateNumber((double)instance->num_vehicles);
        cVar12 = cJSON_AddItemToObject(pcVar29,"numVehicles",pcVar30);
        pcVar29 = cJSON_CreateObject();
        cVar13 = cJSON_AddItemToObject((cJSON *)fh,"solveStatus",pcVar29);
        pcVar30 = cJSON_CreateNumber((double)status);
        uVar14 = cJSON_AddItemToObject(pcVar29,"code",pcVar30);
        pcVar30 = cJSON_CreateBool((uint)((status & SOLVE_STATUS_ERR) != SOLVE_STATUS_NULL));
        uVar15 = cJSON_AddItemToObject(pcVar29,"erroredOut",pcVar30);
        pcVar30 = cJSON_CreateBool((uint)bVar34);
        uVar16 = cJSON_AddItemToObject(pcVar29,"containsPrimalSolution",pcVar30);
        pcVar30 = cJSON_CreateBool((uint)((status & SOLVE_STATUS_CLOSED_PROBLEM) !=
                                         SOLVE_STATUS_NULL));
        uVar17 = cJSON_AddItemToObject(pcVar29,"closedProblem",pcVar30);
        pcVar30 = cJSON_CreateBool((uint)((status & SOLVE_STATUS_ABORTION_RES_EXHAUSTED) !=
                                         SOLVE_STATUS_NULL));
        uVar18 = cJSON_AddItemToObject(pcVar29,"resExhaustionAbortion",pcVar30);
        pcVar30 = cJSON_CreateBool((uint)((status & SOLVE_STATUS_ABORTION_SIGTERM) !=
                                         SOLVE_STATUS_NULL));
        uVar19 = cJSON_AddItemToObject(pcVar29,"sigTermAbortion",pcVar30);
        pcVar29 = cJSON_CreateObject();
        uVar20 = cJSON_AddItemToObject((cJSON *)fh,"timingInfo",pcVar29);
        timerepr_from_usecs((TimeRepr *)&time,timing.took_usecs);
        timerepr_to_string((TimeRepr *)&time,(char *)&timerepr.milliseconds,0x1000);
        pcVar30 = cJSON_CreateNumber((double)timing.took_usecs * 1e-06);
        uVar21 = cJSON_AddItemToObject(pcVar29,"took",pcVar30);
        pcVar30 = cJSON_CreateString((char *)&timerepr.milliseconds);
        uVar22 = cJSON_AddItemToObject(pcVar29,"tookRepr",pcVar30);
        pcVar31 = ctime(&timing.started);
        sVar32 = strlen(pcVar31);
        pcVar31[sVar32 - 1] = '\0';
        pcVar30 = cJSON_CreateString(pcVar31);
        uVar23 = cJSON_AddItemToObject(pcVar29,"started",pcVar30);
        pcVar31 = ctime(&timing.ended);
        sVar32 = strlen(pcVar31);
        pcVar31[sVar32 - 1] = '\0';
        pcVar30 = cJSON_CreateString(pcVar31);
        uVar24 = cJSON_AddItemToObject(pcVar29,"ended",pcVar30);
        pcVar29 = cJSON_CreateObject();
        uVar25 = cJSON_AddItemToObject((cJSON *)fh,"bounds",pcVar29);
        pcVar30 = cJSON_CreateNumber(solution->dual_bound);
        uVar26 = cJSON_AddItemToObject(pcVar29,"dual",pcVar30);
        pcVar30 = cJSON_CreateNumber(solution->primal_bound);
        uVar27 = cJSON_AddItemToObject(pcVar29,"primal",pcVar30);
        dVar35 = solution_relgap(solution);
        pcVar30 = cJSON_CreateNumber(dVar35);
        uVar28 = cJSON_AddItemToObject(pcVar29,"gap",pcVar30);
        instance_info_obj._2_1_ =
             ((((((((((((((((byte)((((((((uVar2 & 1) != 0 & uVar3) != 0 & uVar4) != 0 & uVar5) != 0
                                     & uVar6) != 0 & uVar7) != 0 & uVar8) != 0 & (byte)cVar9 &
                                   (byte)cVar10 & (byte)cVar11 & (byte)cVar12 & (byte)cVar13) &
                           uVar14) != 0 & uVar15) != 0 & uVar16) != 0 & uVar17) != 0 & uVar18) != 0
                      & uVar19) != 0 & uVar20) != 0 & uVar21) != 0 & uVar22) != 0 & uVar23) != 0 &
                 uVar24) != 0 & uVar25) != 0 & uVar26) != 0 & uVar27) != 0 & uVar28) != 0;
        if (bVar34) {
          pcVar29 = cJSON_CreateObject();
          uVar2 = cJSON_AddItemToObject((cJSON *)fh,"tourInfo",pcVar29);
          dVar35 = tour_eval(instance,&solution->tour);
          num = tour_profit(instance,&solution->tour);
          num_00 = tour_demand(instance,&solution->tour);
          pcVar30 = cJSON_CreateNumber(dVar35);
          uVar3 = cJSON_AddItemToObject(pcVar29,"cost",pcVar30);
          pcVar30 = cJSON_CreateNumber(num);
          uVar4 = cJSON_AddItemToObject(pcVar29,"profit",pcVar30);
          pcVar30 = cJSON_CreateNumber(num_00);
          uVar5 = cJSON_AddItemToObject(pcVar29,"demand",pcVar30);
          pcVar30 = cJSON_CreateArray();
          constants_obj._4_4_ = 0;
          do {
            piVar33 = tsucc(&solution->tour,constants_obj._4_4_);
            iVar1 = *piVar33;
            item = cJSON_CreateNumber((double)constants_obj._4_4_);
            cJSON_AddItemToArray(pcVar30,item);
            constants_obj._4_4_ = iVar1;
          } while (iVar1 != 0);
          uVar6 = cJSON_AddItemToObject(pcVar29,"route",pcVar30);
          instance_info_obj._2_1_ =
               (((((instance_info_obj._2_1_ & uVar2) != 0 & uVar3) != 0 & uVar4) != 0 & uVar5) != 0
               & uVar6) != 0;
        }
        pcVar29 = cJSON_CreateObject();
        uVar2 = cJSON_AddItemToObject((cJSON *)fh,"constants",pcVar29);
        pcVar30 = cJSON_CreateNumber(1e-06);
        uVar3 = cJSON_AddItemToObject(pcVar29,"COST_TOLERANCE",pcVar30);
        if (((instance_info_obj._2_1_ & uVar2) != 0 & uVar3) == 0) {
          log_log(0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/main.c"
                  ,0x133,
                  "%s :: Failed to add all the necessary JSON elements to the parent JSON root object"
                  ,"writeout_json_report");
        }
        else {
          pcVar31 = cJSON_Print((cJSON *)fh);
          fprintf(__stream,"%s",pcVar31);
          free(pcVar31);
        }
      }
    }
    if (fh != (FILE *)0x0) {
      cJSON_Delete((cJSON *)fh);
    }
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
  }
  return;
}

Assistant:

static void writeout_json_report(AppCtx *ctx, Instance *instance,
                                 Solution *solution, SolveStatus status,
                                 Timing timing) {
    if (!ctx->json_report_path) {
        return;
    }

    cJSON *root = NULL;
    FILE *fh = fopen(ctx->json_report_path, "w");
    if (!fh) {
        log_fatal("%s: failed to open file for writing JSON report",
                  ctx->json_report_path);
        goto cleanup;
    }

    root = cJSON_CreateObject();
    if (!root) {
        log_fatal("%s :: Failed to create JSON root object", __func__);
        goto cleanup;
    }

    bool primal_sol_avail = BOOL(status & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL);
    bool valid = status != 0 && !BOOL(status & SOLVE_STATUS_ERR);
    bool sigterm_abortion = BOOL(status & SOLVE_STATUS_ABORTION_SIGTERM);
    bool res_exhaustion_abortion =
        BOOL(status & SOLVE_STATUS_ABORTION_RES_EXHAUSTED);
    bool closed_problem = BOOL(status & SOLVE_STATUS_CLOSED_PROBLEM);

    bool s = true;
    s &= cJSON_AddItemToObject(root, "solverName",
                               cJSON_CreateString(ctx->solver));
    s &= cJSON_AddItemToObject(root, "timeLimit",
                               cJSON_CreateNumber(ctx->timelimit));
    s &= cJSON_AddItemToObject(root, "randomSeed",
                               cJSON_CreateNumber(ctx->randomseed));
    s &= cJSON_AddItemToObject(
        root, "cmdLineDefines",
        cJSON_CreateStringArray(ctx->defines, ctx->num_defines));
    s &= cJSON_AddItemToObject(root, "inputFile",
                               cJSON_CreateString(ctx->instance_filepath));

    cJSON *instance_info_obj = cJSON_CreateObject();
    s &= cJSON_AddItemToObject(root, "instanceInfo", instance_info_obj);
    {
        s &= cJSON_AddItemToObject(
            instance_info_obj, "name",
            cJSON_CreateString(instance->name ? instance->name : ""));
        s &= cJSON_AddItemToObject(
            instance_info_obj, "comment",
            cJSON_CreateString(instance->comment ? instance->comment : ""));
        s &= cJSON_AddItemToObject(instance_info_obj, "vehicleCap",
                                   cJSON_CreateNumber(instance->vehicle_cap));
        s &= cJSON_AddItemToObject(instance_info_obj, "numCustomers",
                                   cJSON_CreateNumber(instance->num_customers));
        s &= cJSON_AddItemToObject(instance_info_obj, "numVehicles",
                                   cJSON_CreateNumber(instance->num_vehicles));
    }

    cJSON *status_obj = cJSON_CreateObject();
    s &= cJSON_AddItemToObject(root, "solveStatus", status_obj);
    {
        s &= cJSON_AddItemToObject(status_obj, "code",
                                   cJSON_CreateNumber(status));

        s &= cJSON_AddItemToObject(
            status_obj, "erroredOut",
            cJSON_CreateBool(BOOL(status & SOLVE_STATUS_ERR)));

        s &= cJSON_AddItemToObject(status_obj, "containsPrimalSolution",
                                   cJSON_CreateBool(primal_sol_avail));

        s &= cJSON_AddItemToObject(status_obj, "closedProblem",
                                   cJSON_CreateBool(closed_problem));

        s &= cJSON_AddItemToObject(status_obj, "resExhaustionAbortion",
                                   cJSON_CreateBool(res_exhaustion_abortion));

        s &= cJSON_AddItemToObject(status_obj, "sigTermAbortion",
                                   cJSON_CreateBool(sigterm_abortion));
    }

    cJSON *timing_obj = cJSON_CreateObject();
    s &= cJSON_AddItemToObject(root, "timingInfo", timing_obj);
    {
        enum {
            TIMEREPR_LEN = 4096,
        };

        char timerepr_str[TIMEREPR_LEN];
        TimeRepr timerepr = timerepr_from_usecs(timing.took_usecs);
        timerepr_to_string(&timerepr, timerepr_str, ARRAY_LEN(timerepr_str));

        s &= cJSON_AddItemToObject(
            timing_obj, "took",
            cJSON_CreateNumber((double)timing.took_usecs * USECS_TO_SECS));
        s &= cJSON_AddItemToObject(timing_obj, "tookRepr",
                                   cJSON_CreateString(timerepr_str));

        char *time = ctime(&timing.started);
        // Remove newline introduced from ctime
        time[strlen(time) - 1] = 0;

        s &= cJSON_AddItemToObject(timing_obj, "started",
                                   cJSON_CreateString(time));

        time = ctime(&timing.ended);
        // Remove newline introduced from ctime
        time[strlen(time) - 1] = 0;
        s &= cJSON_AddItemToObject(timing_obj, "ended",
                                   cJSON_CreateString(time));
    }

    cJSON *bounds_obj = cJSON_CreateObject();
    s &= cJSON_AddItemToObject(root, "bounds", bounds_obj);
    {

        s &= cJSON_AddItemToObject(bounds_obj, "dual",
                                   cJSON_CreateNumber(solution->dual_bound));

        s &= cJSON_AddItemToObject(bounds_obj, "primal",
                                   cJSON_CreateNumber(solution->primal_bound));

        s &= cJSON_AddItemToObject(
            bounds_obj, "gap", cJSON_CreateNumber(solution_relgap(solution)));
    }

    if (primal_sol_avail) {
        cJSON *tour_info_obj = cJSON_CreateObject();
        s &= cJSON_AddItemToObject(root, "tourInfo", tour_info_obj);
        {
            double cost = tour_eval(instance, &solution->tour);
            double profit = tour_profit(instance, &solution->tour);
            double demand = tour_demand(instance, &solution->tour);

            s &= cJSON_AddItemToObject(tour_info_obj, "cost",
                                       cJSON_CreateNumber(cost));
            s &= cJSON_AddItemToObject(tour_info_obj, "profit",
                                       cJSON_CreateNumber(profit));
            s &= cJSON_AddItemToObject(tour_info_obj, "demand",
                                       cJSON_CreateNumber(demand));

            cJSON *route_array = cJSON_CreateArray();
            int32_t curr_vertex = 0;
            int32_t next_vertex = curr_vertex;
            do {
                next_vertex = *tsucc(&solution->tour, curr_vertex);
                cJSON_AddItemToArray(route_array,
                                     cJSON_CreateNumber(curr_vertex));

                curr_vertex = next_vertex;
            } while (curr_vertex != 0);
            s &= cJSON_AddItemToObject(tour_info_obj, "route", route_array);
        }
    }

    cJSON *constants_obj = cJSON_CreateObject();
    s &= cJSON_AddItemToObject(root, "constants", constants_obj);
    {
        s &= cJSON_AddItemToObject(constants_obj, "COST_TOLERANCE",
                                   cJSON_CreateNumber(COST_TOLERANCE));
    }

    if (!s) {
        log_fatal("%s :: Failed to add all the necessary JSON elements to the "
                  "parent JSON root object",
                  __func__);
        goto cleanup;
    }

    char *content = cJSON_Print(root);
    fprintf(fh, "%s", content);
    free(content);

cleanup:
    if (root)
        cJSON_Delete(root);
    if (fh)
        fclose(fh);
}